

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::cast_float16_to_float32(Mat *src,Mat *dst,Allocator *allocator,int num_threads)

{
  Option *pOVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Option opt;
  ParamDict pd;
  Layer *cast;
  undefined8 in_stack_fffffffffffff9e8;
  ParamDict *this;
  undefined4 local_608;
  undefined4 uStack_604;
  undefined8 uStack_600;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  int iStack_5ec;
  undefined8 local_5e8;
  ParamDict *in_stack_fffffffffffffa20;
  ParamDict local_5c8;
  Layer *local_28;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = create_layer((int)((ulong)in_stack_fffffffffffff9e8 >> 0x20));
  this = &local_5c8;
  ParamDict::ParamDict(in_stack_fffffffffffffa20);
  ParamDict::set(this,0,2);
  ParamDict::set(&local_5c8,1,1);
  (*local_28->_vptr_Layer[2])(local_28,&local_5c8);
  pOVar1 = get_default_option();
  local_5e8._0_4_ = pOVar1->use_sgemm_convolution;
  local_5e8._4_4_ = pOVar1->use_int8_inference;
  local_608 = *(undefined4 *)pOVar1;
  local_5f8 = *(undefined4 *)&pOVar1->workspace_allocator;
  uStack_5f4 = *(undefined4 *)((long)&pOVar1->workspace_allocator + 4);
  uStack_5f0 = *(undefined4 *)&pOVar1->vulkan_compute;
  iStack_5ec = pOVar1->use_winograd_convolution;
  uStack_604 = local_1c;
  uStack_600 = local_18;
  (*local_28->_vptr_Layer[7])(local_28,local_8,local_10,&local_608);
  if (local_28 != (Layer *)0x0) {
    (*local_28->_vptr_Layer[1])();
  }
  ParamDict::~ParamDict(this);
  return;
}

Assistant:

void cast_float16_to_float32(const Mat& src, Mat& dst, Allocator* allocator, int num_threads)
{
    ncnn::Layer* cast = ncnn::create_layer(ncnn::LayerType::Cast);

    ncnn::ParamDict pd;
    pd.set(0, 2);
    pd.set(1, 1);

    cast->load_param(pd);

    ncnn::Option opt = ncnn::get_default_option();
    opt.num_threads = num_threads;
    opt.blob_allocator = allocator;

    cast->forward(src, dst, opt);

    delete cast;
}